

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

CpuSet * ncnn::get_cpu_thread_affinity_mask(int powersave)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  CpuSet *pCVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int max_freq_khz;
  int iVar10;
  ulong uVar11;
  int iVar12;
  byte bVar13;
  int freq_khz;
  vector<int,_std::allocator<int>_> cpu_max_freq_khz;
  char path [256];
  int local_15c;
  uint local_158;
  int local_154;
  vector<int,_std::allocator<int>_> local_150;
  allocator_type local_138 [264];
  
  bVar13 = 0;
  _DAT_005e5348 = 0;
  uRam00000000005e5350 = 0;
  _DAT_005e5338 = 0;
  uRam00000000005e5340 = 0;
  _DAT_005e5328 = 0;
  uRam00000000005e5330 = 0;
  _DAT_005e5318 = 0;
  uRam00000000005e5320 = 0;
  _DAT_005e5308 = 0;
  uRam00000000005e5310 = 0;
  _DAT_005e52f8 = 0;
  uRam00000000005e5300 = 0;
  _DAT_005e52e8 = 0;
  uRam00000000005e52f0 = 0;
  g_thread_affinity_mask_all = 0;
  DAT_005e52e0 = 0;
  local_158 = powersave;
  std::vector<int,_std::allocator<int>_>::vector(&local_150,(long)(int)g_cpucount,local_138);
  iVar1 = 0x7fffffff;
  if ((int)g_cpucount < 1) {
    iVar12 = 0;
  }
  else {
    uVar11 = 0;
    iVar12 = 0;
    do {
      local_154 = iVar1;
      sprintf((char *)local_138,"/sys/devices/system/cpu/cpufreq/stats/cpu%d/time_in_state",
              uVar11 & 0xffffffff);
      pFVar4 = fopen((char *)local_138,"rb");
      if (pFVar4 == (FILE *)0x0) {
        sprintf((char *)local_138,"/sys/devices/system/cpu/cpu%d/cpufreq/stats/time_in_state",
                uVar11 & 0xffffffff);
        pFVar4 = fopen((char *)local_138,"rb");
        if (pFVar4 != (FILE *)0x0) {
          iVar1 = 0;
          do {
            iVar10 = iVar1;
            iVar1 = feof(pFVar4);
            if (iVar1 != 0) break;
            local_15c = 0;
            iVar2 = __isoc99_fscanf(pFVar4,"%d %*d",&local_15c);
            iVar1 = local_15c;
            if (local_15c <= iVar10) {
              iVar1 = iVar10;
            }
          } while (iVar2 == 1);
          fclose(pFVar4);
          if (iVar10 != 0) goto LAB_0016de11;
        }
        sprintf((char *)local_138,"/sys/devices/system/cpu/cpu%d/cpufreq/cpuinfo_max_freq",
                uVar11 & 0xffffffff);
        pFVar4 = fopen((char *)local_138,"rb");
        if (pFVar4 == (FILE *)0x0) {
          iVar10 = -1;
        }
        else {
          local_15c = -1;
          uVar3 = __isoc99_fscanf(pFVar4,"%d",&local_15c);
          if (uVar3 != 1) {
            get_cpu_thread_affinity_mask((ncnn *)(ulong)uVar3);
          }
          fclose(pFVar4);
          iVar10 = local_15c;
        }
      }
      else {
        iVar1 = 0;
        do {
          iVar10 = iVar1;
          iVar1 = feof(pFVar4);
          if (iVar1 != 0) break;
          local_15c = 0;
          iVar2 = __isoc99_fscanf(pFVar4,"%d %*d",&local_15c);
          iVar1 = local_15c;
          if (local_15c <= iVar10) {
            iVar1 = iVar10;
          }
        } while (iVar2 == 1);
        fclose(pFVar4);
      }
LAB_0016de11:
      if (iVar12 < iVar10) {
        iVar12 = iVar10;
      }
      iVar1 = local_154;
      if (iVar10 < local_154) {
        iVar1 = iVar10;
      }
      local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = iVar10;
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)(int)g_cpucount);
  }
  iVar1 = (iVar1 + iVar12) / 2;
  if (iVar1 == iVar12) {
    _DAT_005e53c8 = 0;
    uRam00000000005e53d0 = 0;
    _DAT_005e53b8 = 0;
    uRam00000000005e53c0 = 0;
    _DAT_005e53a8 = 0;
    uRam00000000005e53b0 = 0;
    _DAT_005e5398 = 0;
    uRam00000000005e53a0 = 0;
    _DAT_005e5388 = 0;
    uRam00000000005e5390 = 0;
    _DAT_005e5378 = 0;
    uRam00000000005e5380 = 0;
    _DAT_005e5368 = 0;
    uRam00000000005e5370 = 0;
    g_thread_affinity_mask_little = 0;
    uRam00000000005e5360 = 0;
    puVar9 = &g_thread_affinity_mask_all;
    puVar8 = &g_thread_affinity_mask_big;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar8 = *puVar9;
      puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
    }
  }
  else if (0 < (int)g_cpucount) {
    uVar7 = (ulong)g_cpucount;
    uVar11 = 0;
    do {
      if (uVar11 < 0x400) {
        puVar9 = &g_thread_affinity_mask_big;
        if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11] < iVar1) {
          puVar9 = &g_thread_affinity_mask_little;
        }
        puVar9[uVar11 >> 6] = puVar9[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
      }
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
  }
  if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158 < 3) {
    pCVar5 = (CpuSet *)(&PTR_g_thread_affinity_mask_all_005b6dd8)[local_158];
  }
  else {
    get_cpu_thread_affinity_mask((ncnn *)(ulong)local_158);
    pCVar5 = (CpuSet *)&g_thread_affinity_mask_all;
  }
  return pCVar5;
}

Assistant:

const CpuSet& get_cpu_thread_affinity_mask(int powersave)
{
    setup_thread_affinity_masks();

    if (powersave == 0)
        return g_thread_affinity_mask_all;

    if (powersave == 1)
        return g_thread_affinity_mask_little;

    if (powersave == 2)
        return g_thread_affinity_mask_big;

    NCNN_LOGE("powersave %d not supported", powersave);

    // fallback to all cores anyway
    return g_thread_affinity_mask_all;
}